

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O1

int Quantize2Blocks_SSE2(int16_t *in,int16_t *out,VP8Matrix *mtx)

{
  int16_t iVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  uint16_t uVar17;
  uint16_t uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  uint16_t uVar24;
  uint16_t uVar25;
  uint16_t uVar26;
  uint16_t uVar27;
  uint16_t uVar28;
  uint16_t uVar29;
  uint16_t uVar30;
  uint16_t uVar31;
  uint16_t uVar32;
  uint16_t uVar33;
  uint16_t uVar34;
  uint16_t uVar35;
  uint16_t uVar36;
  uint16_t uVar37;
  uint16_t uVar38;
  uint16_t uVar39;
  uint32_t uVar40;
  uint32_t uVar41;
  uint32_t uVar42;
  uint32_t uVar43;
  uint32_t uVar44;
  uint32_t uVar45;
  uint32_t uVar46;
  uint32_t uVar47;
  uint32_t uVar48;
  uint32_t uVar49;
  uint32_t uVar50;
  uint32_t uVar51;
  uint32_t uVar52;
  uint32_t uVar53;
  uint32_t uVar54;
  uint32_t uVar55;
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  unkbyte10 Var60;
  unkbyte10 Var61;
  int iVar62;
  int iVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  short sVar70;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  undefined1 auVar71 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  int iVar81;
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [12];
  short sVar90;
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  int iVar91;
  short sVar96;
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  short sVar97;
  short sVar98;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  short sVar114;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  short sVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [12];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar82 [12];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar92 [12];
  undefined1 auVar94 [16];
  undefined1 auVar126 [16];
  
  auVar71 = *(undefined1 (*) [16])in;
  auVar79 = *(undefined1 (*) [16])(in + 8);
  uVar8 = mtx->q_[0];
  uVar9 = mtx->q_[1];
  uVar10 = mtx->q_[2];
  uVar11 = mtx->q_[3];
  uVar12 = mtx->q_[4];
  uVar13 = mtx->q_[5];
  uVar14 = mtx->q_[6];
  uVar15 = mtx->q_[7];
  uVar16 = mtx->q_[8];
  uVar17 = mtx->q_[9];
  uVar18 = mtx->q_[10];
  uVar19 = mtx->q_[0xb];
  uVar20 = mtx->q_[0xc];
  uVar21 = mtx->q_[0xd];
  uVar22 = mtx->q_[0xe];
  uVar23 = mtx->q_[0xf];
  auVar64 = *(undefined1 (*) [16])mtx->iq_;
  auVar67 = *(undefined1 (*) [16])(mtx->iq_ + 8);
  sVar70 = auVar71._0_2_;
  sVar90 = -sVar70;
  sVar72 = auVar71._2_2_;
  sVar96 = -sVar72;
  sVar73 = auVar71._4_2_;
  sVar2 = -sVar73;
  sVar74 = auVar71._6_2_;
  sVar3 = -sVar74;
  sVar75 = auVar71._8_2_;
  sVar4 = -sVar75;
  sVar76 = auVar71._10_2_;
  sVar5 = -sVar76;
  sVar77 = auVar71._12_2_;
  sVar6 = -sVar77;
  sVar78 = auVar71._14_2_;
  sVar7 = -sVar78;
  auVar71 = psraw(auVar71,0xf);
  sVar97 = auVar79._0_2_;
  sVar98 = -sVar97;
  sVar102 = auVar79._2_2_;
  sVar103 = -sVar102;
  sVar104 = auVar79._4_2_;
  sVar105 = -sVar104;
  sVar106 = auVar79._6_2_;
  sVar107 = -sVar106;
  sVar108 = auVar79._8_2_;
  sVar109 = -sVar108;
  sVar110 = auVar79._10_2_;
  sVar111 = -sVar110;
  sVar112 = auVar79._12_2_;
  sVar113 = -sVar112;
  sVar114 = auVar79._14_2_;
  sVar115 = -sVar114;
  auVar99 = psraw(auVar79,0xf);
  uVar24 = mtx->sharpen_[0];
  uVar25 = mtx->sharpen_[1];
  uVar26 = mtx->sharpen_[2];
  uVar27 = mtx->sharpen_[3];
  uVar28 = mtx->sharpen_[4];
  uVar29 = mtx->sharpen_[5];
  uVar30 = mtx->sharpen_[6];
  uVar31 = mtx->sharpen_[7];
  uVar32 = mtx->sharpen_[8];
  uVar33 = mtx->sharpen_[9];
  uVar34 = mtx->sharpen_[10];
  uVar35 = mtx->sharpen_[0xb];
  uVar36 = mtx->sharpen_[0xc];
  uVar37 = mtx->sharpen_[0xd];
  uVar38 = mtx->sharpen_[0xe];
  uVar39 = mtx->sharpen_[0xf];
  auVar93._0_2_ =
       ((ushort)(sVar90 < sVar70) * sVar70 | (ushort)(sVar90 >= sVar70) * sVar90) + uVar24;
  auVar93._2_2_ =
       ((ushort)(sVar96 < sVar72) * sVar72 | (ushort)(sVar96 >= sVar72) * sVar96) + uVar25;
  auVar93._4_2_ = ((ushort)(sVar2 < sVar73) * sVar73 | (ushort)(sVar2 >= sVar73) * sVar2) + uVar26;
  auVar93._6_2_ = ((ushort)(sVar3 < sVar74) * sVar74 | (ushort)(sVar3 >= sVar74) * sVar3) + uVar27;
  auVar93._8_2_ = ((ushort)(sVar4 < sVar75) * sVar75 | (ushort)(sVar4 >= sVar75) * sVar4) + uVar28;
  auVar93._10_2_ = ((ushort)(sVar5 < sVar76) * sVar76 | (ushort)(sVar5 >= sVar76) * sVar5) + uVar29;
  auVar93._12_2_ = ((ushort)(sVar6 < sVar77) * sVar77 | (ushort)(sVar6 >= sVar77) * sVar6) + uVar30;
  auVar93._14_2_ = ((ushort)(sVar7 < sVar78) * sVar78 | (ushort)(sVar7 >= sVar78) * sVar7) + uVar31;
  auVar87._0_2_ =
       ((ushort)(sVar98 < sVar97) * sVar97 | (ushort)(sVar98 >= sVar97) * sVar98) + uVar32;
  auVar87._2_2_ =
       ((ushort)(sVar103 < sVar102) * sVar102 | (ushort)(sVar103 >= sVar102) * sVar103) + uVar33;
  auVar87._4_2_ =
       ((ushort)(sVar105 < sVar104) * sVar104 | (ushort)(sVar105 >= sVar104) * sVar105) + uVar34;
  auVar87._6_2_ =
       ((ushort)(sVar107 < sVar106) * sVar106 | (ushort)(sVar107 >= sVar106) * sVar107) + uVar35;
  auVar87._8_2_ =
       ((ushort)(sVar109 < sVar108) * sVar108 | (ushort)(sVar109 >= sVar108) * sVar109) + uVar36;
  auVar87._10_2_ =
       ((ushort)(sVar111 < sVar110) * sVar110 | (ushort)(sVar111 >= sVar110) * sVar111) + uVar37;
  auVar87._12_2_ =
       ((ushort)(sVar113 < sVar112) * sVar112 | (ushort)(sVar113 >= sVar112) * sVar113) + uVar38;
  auVar87._14_2_ =
       ((ushort)(sVar115 < sVar114) * sVar114 | (ushort)(sVar115 >= sVar114) * sVar115) + uVar39;
  auVar79 = pmulhuw(auVar93,auVar64);
  sVar96 = auVar93._6_2_ * auVar64._6_2_;
  auVar80 = pmulhuw(auVar87,auVar67);
  sVar90 = auVar87._6_2_ * auVar67._6_2_;
  iVar62 = CONCAT22(auVar79._6_2_,sVar96);
  Var60 = CONCAT64(CONCAT42(iVar62,auVar79._4_2_),CONCAT22(auVar93._4_2_ * auVar64._4_2_,sVar96));
  auVar56._4_8_ = (long)((unkuint10)Var60 >> 0x10);
  auVar56._2_2_ = auVar79._2_2_;
  auVar56._0_2_ = auVar93._2_2_ * auVar64._2_2_;
  iVar91 = CONCAT22(auVar79._8_2_,auVar93._8_2_ * auVar64._8_2_);
  auVar92._0_8_ = CONCAT26(auVar79._10_2_,CONCAT24(auVar93._10_2_ * auVar64._10_2_,iVar91));
  auVar92._8_2_ = auVar93._12_2_ * auVar64._12_2_;
  auVar92._10_2_ = auVar79._12_2_;
  auVar94._12_2_ = auVar93._14_2_ * auVar64._14_2_;
  auVar94._0_12_ = auVar92;
  auVar94._14_2_ = auVar79._14_2_;
  iVar63 = CONCAT22(auVar80._6_2_,sVar90);
  Var61 = CONCAT64(CONCAT42(iVar63,auVar80._4_2_),CONCAT22(auVar87._4_2_ * auVar67._4_2_,sVar90));
  auVar57._4_8_ = (long)((unkuint10)Var61 >> 0x10);
  auVar57._2_2_ = auVar80._2_2_;
  auVar57._0_2_ = auVar87._2_2_ * auVar67._2_2_;
  iVar81 = CONCAT22(auVar80._8_2_,auVar87._8_2_ * auVar67._8_2_);
  auVar86._0_8_ = CONCAT26(auVar80._10_2_,CONCAT24(auVar87._10_2_ * auVar67._10_2_,iVar81));
  auVar86._8_2_ = auVar87._12_2_ * auVar67._12_2_;
  auVar86._10_2_ = auVar80._12_2_;
  auVar88._12_2_ = auVar87._14_2_ * auVar67._14_2_;
  auVar88._0_12_ = auVar86;
  auVar88._14_2_ = auVar80._14_2_;
  uVar40 = mtx->bias_[0];
  uVar41 = mtx->bias_[1];
  uVar42 = mtx->bias_[2];
  uVar43 = mtx->bias_[3];
  uVar44 = mtx->bias_[4];
  uVar45 = mtx->bias_[5];
  uVar46 = mtx->bias_[6];
  uVar47 = mtx->bias_[7];
  uVar48 = mtx->bias_[8];
  uVar49 = mtx->bias_[9];
  uVar50 = mtx->bias_[10];
  uVar51 = mtx->bias_[0xb];
  auVar116._0_4_ = (int)(CONCAT22(auVar79._0_2_,auVar93._0_2_ * auVar64._0_2_) + uVar40) >> 0x11;
  auVar116._4_4_ = (int)(auVar56._0_4_ + uVar41) >> 0x11;
  auVar116._8_4_ = (int)((int)((unkuint10)Var60 >> 0x10) + uVar42) >> 0x11;
  auVar116._12_4_ = (int)(iVar62 + uVar43) >> 0x11;
  auVar95._0_4_ = (int)(iVar91 + uVar44) >> 0x11;
  auVar95._4_4_ = (int)((int)((ulong)auVar92._0_8_ >> 0x20) + uVar45) >> 0x11;
  auVar95._8_4_ = (int)(auVar92._8_4_ + uVar46) >> 0x11;
  auVar95._12_4_ = (int)(auVar94._12_4_ + uVar47) >> 0x11;
  auVar79 = packssdw(auVar116,auVar95);
  uVar52 = mtx->bias_[0xc];
  uVar53 = mtx->bias_[0xd];
  uVar54 = mtx->bias_[0xe];
  uVar55 = mtx->bias_[0xf];
  auVar122._0_4_ = (int)(CONCAT22(auVar80._0_2_,auVar87._0_2_ * auVar67._0_2_) + uVar48) >> 0x11;
  auVar122._4_4_ = (int)(auVar57._0_4_ + uVar49) >> 0x11;
  auVar122._8_4_ = (int)((int)((unkuint10)Var61 >> 0x10) + uVar50) >> 0x11;
  auVar122._12_4_ = (int)(iVar63 + uVar51) >> 0x11;
  auVar89._0_4_ = (int)(iVar81 + uVar52) >> 0x11;
  auVar89._4_4_ = (int)((int)((ulong)auVar86._0_8_ >> 0x20) + uVar53) >> 0x11;
  auVar89._8_4_ = (int)(auVar86._8_4_ + uVar54) >> 0x11;
  auVar89._12_4_ = (int)(auVar88._12_4_ + uVar55) >> 0x11;
  auVar80 = packssdw(auVar122,auVar89);
  sVar90 = auVar79._0_2_;
  auVar117._0_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar79._2_2_;
  auVar117._2_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar79._4_2_;
  auVar117._4_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar79._6_2_;
  auVar117._6_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar79._8_2_;
  auVar117._8_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar79._10_2_;
  auVar117._10_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar79._12_2_;
  sVar96 = auVar79._14_2_;
  auVar117._12_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  auVar117._14_2_ = (ushort)(0x7ff < sVar96) * 0x7ff | (ushort)(0x7ff >= sVar96) * sVar96;
  auVar117 = auVar117 ^ auVar71;
  auVar118._0_2_ = auVar117._0_2_ - auVar71._0_2_;
  auVar118._2_2_ = auVar117._2_2_ - auVar71._2_2_;
  auVar118._4_2_ = auVar117._4_2_ - auVar71._4_2_;
  auVar118._6_2_ = auVar117._6_2_ - auVar71._6_2_;
  auVar118._8_2_ = auVar117._8_2_ - auVar71._8_2_;
  auVar118._10_2_ = auVar117._10_2_ - auVar71._10_2_;
  auVar118._12_2_ = auVar117._12_2_ - auVar71._12_2_;
  auVar118._14_2_ = auVar117._14_2_ - auVar71._14_2_;
  sVar90 = auVar80._0_2_;
  auVar123._0_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar80._2_2_;
  auVar123._2_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar80._4_2_;
  auVar123._4_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar80._6_2_;
  auVar123._6_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar80._8_2_;
  auVar123._8_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar80._10_2_;
  auVar123._10_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar80._12_2_;
  sVar96 = auVar80._14_2_;
  auVar123._12_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  auVar123._14_2_ = (ushort)(0x7ff < sVar96) * 0x7ff | (ushort)(0x7ff >= sVar96) * sVar96;
  auVar123 = auVar123 ^ auVar99;
  auVar124._0_2_ = auVar123._0_2_ - auVar99._0_2_;
  auVar124._2_2_ = auVar123._2_2_ - auVar99._2_2_;
  auVar124._4_2_ = auVar123._4_2_ - auVar99._4_2_;
  auVar124._6_2_ = auVar123._6_2_ - auVar99._6_2_;
  auVar124._8_2_ = auVar123._8_2_ - auVar99._8_2_;
  auVar124._10_2_ = auVar123._10_2_ - auVar99._10_2_;
  auVar124._12_2_ = auVar123._12_2_ - auVar99._12_2_;
  auVar124._14_2_ = auVar123._14_2_ - auVar99._14_2_;
  auVar71 = pshufhw(auVar99,auVar118,0xc6);
  auVar119._0_2_ = auVar118._0_2_ * uVar8;
  auVar119._2_2_ = auVar118._2_2_ * uVar9;
  auVar119._4_2_ = auVar118._4_2_ * uVar10;
  auVar119._6_2_ = auVar118._6_2_ * uVar11;
  auVar119._8_2_ = auVar118._8_2_ * uVar12;
  auVar119._10_2_ = auVar118._10_2_ * uVar13;
  auVar119._12_2_ = auVar118._12_2_ * uVar14;
  auVar119._14_2_ = auVar118._14_2_ * uVar15;
  *(undefined1 (*) [16])in = auVar119;
  auVar79 = pshuflw(auVar119,auVar124,0xc6);
  in[8] = auVar124._0_2_ * uVar16;
  in[9] = auVar124._2_2_ * uVar17;
  in[10] = auVar124._4_2_ * uVar18;
  in[0xb] = auVar124._6_2_ * uVar19;
  in[0xc] = auVar124._8_2_ * uVar20;
  in[0xd] = auVar124._10_2_ * uVar21;
  in[0xe] = auVar124._12_2_ * uVar22;
  in[0xf] = auVar124._14_2_ * uVar23;
  auVar100._0_4_ = auVar71._0_4_;
  auVar100._8_4_ = auVar71._8_4_;
  auVar100._4_4_ = auVar71._12_4_;
  auVar100._12_4_ = auVar71._4_4_;
  auVar71 = pshufhw(auVar100,auVar100,0x39);
  auVar120._0_4_ = auVar79._0_4_;
  auVar120._12_4_ = auVar79._12_4_;
  auVar120._4_4_ = auVar79._8_4_;
  auVar120._8_4_ = auVar79._4_4_;
  auVar79 = pshuflw(auVar120,auVar120,0x39);
  *(undefined1 (*) [16])out = auVar71;
  *(undefined1 (*) [16])(out + 8) = auVar79;
  auVar71 = packsswb(auVar71,auVar79);
  iVar1 = out[3];
  out[3] = out[0xc];
  out[0xc] = iVar1;
  auVar101[0] = -(auVar71[0] == '\0');
  auVar101[1] = -(auVar71[1] == '\0');
  auVar101[2] = -(auVar71[2] == '\0');
  auVar101[3] = -(auVar71[3] == '\0');
  auVar101[4] = -(auVar71[4] == '\0');
  auVar101[5] = -(auVar71[5] == '\0');
  auVar101[6] = -(auVar71[6] == '\0');
  auVar101[7] = -(auVar71[7] == '\0');
  auVar101[8] = -(auVar71[8] == '\0');
  auVar101[9] = -(auVar71[9] == '\0');
  auVar101[10] = -(auVar71[10] == '\0');
  auVar101[0xb] = -(auVar71[0xb] == '\0');
  auVar101[0xc] = -(auVar71[0xc] == '\0');
  auVar101[0xd] = -(auVar71[0xd] == '\0');
  auVar101[0xe] = -(auVar71[0xe] == '\0');
  auVar101[0xf] = -(auVar71[0xf] == '\0');
  auVar71 = *(undefined1 (*) [16])(in + 0x10);
  auVar79 = *(undefined1 (*) [16])(in + 0x18);
  sVar98 = auVar71._0_2_;
  sVar90 = -sVar98;
  sVar103 = auVar71._2_2_;
  sVar96 = -sVar103;
  sVar105 = auVar71._4_2_;
  sVar2 = -sVar105;
  sVar107 = auVar71._6_2_;
  sVar3 = -sVar107;
  sVar109 = auVar71._8_2_;
  sVar4 = -sVar109;
  sVar111 = auVar71._10_2_;
  sVar5 = -sVar111;
  sVar113 = auVar71._12_2_;
  sVar6 = -sVar113;
  sVar115 = auVar71._14_2_;
  sVar7 = -sVar115;
  auVar125._0_2_ =
       ((ushort)(sVar90 < sVar98) * sVar98 | (ushort)(sVar90 >= sVar98) * sVar90) + uVar24;
  auVar125._2_2_ =
       ((ushort)(sVar96 < sVar103) * sVar103 | (ushort)(sVar96 >= sVar103) * sVar96) + uVar25;
  auVar125._4_2_ =
       ((ushort)(sVar2 < sVar105) * sVar105 | (ushort)(sVar2 >= sVar105) * sVar2) + uVar26;
  auVar125._6_2_ =
       ((ushort)(sVar3 < sVar107) * sVar107 | (ushort)(sVar3 >= sVar107) * sVar3) + uVar27;
  auVar125._8_2_ =
       ((ushort)(sVar4 < sVar109) * sVar109 | (ushort)(sVar4 >= sVar109) * sVar4) + uVar28;
  auVar125._10_2_ =
       ((ushort)(sVar5 < sVar111) * sVar111 | (ushort)(sVar5 >= sVar111) * sVar5) + uVar29;
  auVar125._12_2_ =
       ((ushort)(sVar6 < sVar113) * sVar113 | (ushort)(sVar6 >= sVar113) * sVar6) + uVar30;
  auVar125._14_2_ =
       ((ushort)(sVar7 < sVar115) * sVar115 | (ushort)(sVar7 >= sVar115) * sVar7) + uVar31;
  sVar98 = auVar79._0_2_;
  sVar90 = -sVar98;
  sVar103 = auVar79._2_2_;
  sVar96 = -sVar103;
  sVar105 = auVar79._4_2_;
  sVar2 = -sVar105;
  sVar107 = auVar79._6_2_;
  sVar3 = -sVar107;
  sVar109 = auVar79._8_2_;
  sVar4 = -sVar109;
  sVar111 = auVar79._10_2_;
  sVar5 = -sVar111;
  sVar113 = auVar79._12_2_;
  sVar6 = -sVar113;
  sVar115 = auVar79._14_2_;
  sVar7 = -sVar115;
  auVar83._0_2_ =
       ((ushort)(sVar90 < sVar98) * sVar98 | (ushort)(sVar90 >= sVar98) * sVar90) + uVar32;
  auVar83._2_2_ =
       ((ushort)(sVar96 < sVar103) * sVar103 | (ushort)(sVar96 >= sVar103) * sVar96) + uVar33;
  auVar83._4_2_ =
       ((ushort)(sVar2 < sVar105) * sVar105 | (ushort)(sVar2 >= sVar105) * sVar2) + uVar34;
  auVar83._6_2_ =
       ((ushort)(sVar3 < sVar107) * sVar107 | (ushort)(sVar3 >= sVar107) * sVar3) + uVar35;
  auVar83._8_2_ =
       ((ushort)(sVar4 < sVar109) * sVar109 | (ushort)(sVar4 >= sVar109) * sVar4) + uVar36;
  auVar83._10_2_ =
       ((ushort)(sVar5 < sVar111) * sVar111 | (ushort)(sVar5 >= sVar111) * sVar5) + uVar37;
  auVar83._12_2_ =
       ((ushort)(sVar6 < sVar113) * sVar113 | (ushort)(sVar6 >= sVar113) * sVar6) + uVar38;
  auVar83._14_2_ =
       ((ushort)(sVar7 < sVar115) * sVar115 | (ushort)(sVar7 >= sVar115) * sVar7) + uVar39;
  auVar80 = pmulhuw(auVar125,auVar64);
  sVar96 = auVar125._6_2_ * auVar64._6_2_;
  auVar128 = pmulhuw(auVar83,auVar67);
  sVar90 = auVar83._6_2_ * auVar67._6_2_;
  iVar62 = CONCAT22(auVar80._6_2_,sVar96);
  Var60 = CONCAT64(CONCAT42(iVar62,auVar80._4_2_),CONCAT22(auVar125._4_2_ * auVar64._4_2_,sVar96));
  auVar58._4_8_ = (long)((unkuint10)Var60 >> 0x10);
  auVar58._2_2_ = auVar80._2_2_;
  auVar58._0_2_ = auVar125._2_2_ * auVar64._2_2_;
  iVar91 = CONCAT22(auVar80._8_2_,auVar125._8_2_ * auVar64._8_2_);
  auVar121._0_8_ = CONCAT26(auVar80._10_2_,CONCAT24(auVar125._10_2_ * auVar64._10_2_,iVar91));
  auVar121._8_2_ = auVar125._12_2_ * auVar64._12_2_;
  auVar121._10_2_ = auVar80._12_2_;
  auVar126._12_2_ = auVar125._14_2_ * auVar64._14_2_;
  auVar126._0_12_ = auVar121;
  auVar126._14_2_ = auVar80._14_2_;
  iVar63 = CONCAT22(auVar128._6_2_,sVar90);
  Var61 = CONCAT64(CONCAT42(iVar63,auVar128._4_2_),CONCAT22(auVar83._4_2_ * auVar67._4_2_,sVar90));
  auVar59._4_8_ = (long)((unkuint10)Var61 >> 0x10);
  auVar59._2_2_ = auVar128._2_2_;
  auVar59._0_2_ = auVar83._2_2_ * auVar67._2_2_;
  iVar81 = CONCAT22(auVar128._8_2_,auVar83._8_2_ * auVar67._8_2_);
  auVar82._0_8_ = CONCAT26(auVar128._10_2_,CONCAT24(auVar83._10_2_ * auVar67._10_2_,iVar81));
  auVar82._8_2_ = auVar83._12_2_ * auVar67._12_2_;
  auVar82._10_2_ = auVar128._12_2_;
  auVar84._12_2_ = auVar83._14_2_ * auVar67._14_2_;
  auVar84._0_12_ = auVar82;
  auVar84._14_2_ = auVar128._14_2_;
  auVar99._0_4_ = (int)(CONCAT22(auVar80._0_2_,auVar125._0_2_ * auVar64._0_2_) + uVar40) >> 0x11;
  auVar99._4_4_ = (int)(auVar58._0_4_ + uVar41) >> 0x11;
  auVar99._8_4_ = (int)((int)((unkuint10)Var60 >> 0x10) + uVar42) >> 0x11;
  auVar99._12_4_ = (int)(iVar62 + uVar43) >> 0x11;
  auVar127._0_4_ = (int)(iVar91 + uVar44) >> 0x11;
  auVar127._4_4_ = (int)((int)((ulong)auVar121._0_8_ >> 0x20) + uVar45) >> 0x11;
  auVar127._8_4_ = (int)(auVar121._8_4_ + uVar46) >> 0x11;
  auVar127._12_4_ = (int)(auVar126._12_4_ + uVar47) >> 0x11;
  auVar64 = packssdw(auVar99,auVar127);
  auVar66._0_4_ = (int)(CONCAT22(auVar128._0_2_,auVar83._0_2_ * auVar67._0_2_) + uVar48) >> 0x11;
  auVar66._4_4_ = (int)(auVar59._0_4_ + uVar49) >> 0x11;
  auVar66._8_4_ = (int)((int)((unkuint10)Var61 >> 0x10) + uVar50) >> 0x11;
  auVar66._12_4_ = (int)(iVar63 + uVar51) >> 0x11;
  auVar85._0_4_ = (int)(iVar81 + uVar52) >> 0x11;
  auVar85._4_4_ = (int)((int)((ulong)auVar82._0_8_ >> 0x20) + uVar53) >> 0x11;
  auVar85._8_4_ = (int)(auVar82._8_4_ + uVar54) >> 0x11;
  auVar85._12_4_ = (int)(auVar84._12_4_ + uVar55) >> 0x11;
  auVar67 = packssdw(auVar66,auVar85);
  sVar90 = auVar64._0_2_;
  auVar128._0_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar64._2_2_;
  auVar128._2_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar64._4_2_;
  auVar128._4_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar64._6_2_;
  auVar128._6_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar64._8_2_;
  auVar128._8_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar64._10_2_;
  auVar128._10_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar64._12_2_;
  sVar96 = auVar64._14_2_;
  auVar128._12_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  auVar128._14_2_ = (ushort)(0x7ff < sVar96) * 0x7ff | (ushort)(0x7ff >= sVar96) * sVar96;
  sVar90 = auVar67._0_2_;
  auVar68._0_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar67._2_2_;
  auVar68._2_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar67._4_2_;
  auVar68._4_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar67._6_2_;
  auVar68._6_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar67._8_2_;
  auVar68._8_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar67._10_2_;
  auVar68._10_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  sVar90 = auVar67._12_2_;
  sVar96 = auVar67._14_2_;
  auVar68._12_2_ = (ushort)(0x7ff < sVar90) * 0x7ff | (ushort)(0x7ff >= sVar90) * sVar90;
  auVar68._14_2_ = (ushort)(0x7ff < sVar96) * 0x7ff | (ushort)(0x7ff >= sVar96) * sVar96;
  auVar71 = psraw(auVar71,0xf);
  auVar128 = auVar128 ^ auVar71;
  auVar65._0_2_ = auVar128._0_2_ - auVar71._0_2_;
  auVar65._2_2_ = auVar128._2_2_ - auVar71._2_2_;
  auVar65._4_2_ = auVar128._4_2_ - auVar71._4_2_;
  auVar65._6_2_ = auVar128._6_2_ - auVar71._6_2_;
  auVar65._8_2_ = auVar128._8_2_ - auVar71._8_2_;
  auVar65._10_2_ = auVar128._10_2_ - auVar71._10_2_;
  auVar65._12_2_ = auVar128._12_2_ - auVar71._12_2_;
  auVar65._14_2_ = auVar128._14_2_ - auVar71._14_2_;
  auVar71 = psraw(auVar79,0xf);
  auVar68 = auVar68 ^ auVar71;
  auVar69._0_2_ = auVar68._0_2_ - auVar71._0_2_;
  auVar69._2_2_ = auVar68._2_2_ - auVar71._2_2_;
  auVar69._4_2_ = auVar68._4_2_ - auVar71._4_2_;
  auVar69._6_2_ = auVar68._6_2_ - auVar71._6_2_;
  auVar69._8_2_ = auVar68._8_2_ - auVar71._8_2_;
  auVar69._10_2_ = auVar68._10_2_ - auVar71._10_2_;
  auVar69._12_2_ = auVar68._12_2_ - auVar71._12_2_;
  auVar69._14_2_ = auVar68._14_2_ - auVar71._14_2_;
  auVar67._0_2_ = uVar8 * auVar65._0_2_;
  auVar67._2_2_ = uVar9 * auVar65._2_2_;
  auVar67._4_2_ = uVar10 * auVar65._4_2_;
  auVar67._6_2_ = uVar11 * auVar65._6_2_;
  auVar67._8_2_ = uVar12 * auVar65._8_2_;
  auVar67._10_2_ = uVar13 * auVar65._10_2_;
  auVar67._12_2_ = uVar14 * auVar65._12_2_;
  auVar67._14_2_ = uVar15 * auVar65._14_2_;
  *(undefined1 (*) [16])(in + 0x10) = auVar67;
  auVar71._0_2_ = uVar16 * auVar69._0_2_;
  auVar71._2_2_ = uVar17 * auVar69._2_2_;
  auVar71._4_2_ = uVar18 * auVar69._4_2_;
  auVar71._6_2_ = uVar19 * auVar69._6_2_;
  auVar71._8_2_ = uVar20 * auVar69._8_2_;
  auVar71._10_2_ = uVar21 * auVar69._10_2_;
  auVar71._12_2_ = uVar22 * auVar69._12_2_;
  auVar71._14_2_ = uVar23 * auVar69._14_2_;
  *(undefined1 (*) [16])(in + 0x18) = auVar71;
  auVar71 = pshufhw(auVar71,auVar65,0xc6);
  auVar79._0_4_ = auVar71._0_4_;
  auVar79._8_4_ = auVar71._8_4_;
  auVar79._4_4_ = auVar71._12_4_;
  auVar79._12_4_ = auVar71._4_4_;
  auVar71 = pshufhw(auVar79,auVar79,0x39);
  auVar79 = pshuflw(auVar67,auVar69,0xc6);
  auVar80._0_4_ = auVar79._0_4_;
  auVar80._12_4_ = auVar79._12_4_;
  auVar80._4_4_ = auVar79._8_4_;
  auVar80._8_4_ = auVar79._4_4_;
  auVar79 = pshuflw(auVar80,auVar80,0x39);
  *(undefined1 (*) [16])(out + 0x10) = auVar71;
  *(undefined1 (*) [16])(out + 0x18) = auVar79;
  auVar71 = packsswb(auVar71,auVar79);
  auVar64[0] = -(auVar71[0] == '\0');
  auVar64[1] = -(auVar71[1] == '\0');
  auVar64[2] = -(auVar71[2] == '\0');
  auVar64[3] = -(auVar71[3] == '\0');
  auVar64[4] = -(auVar71[4] == '\0');
  auVar64[5] = -(auVar71[5] == '\0');
  auVar64[6] = -(auVar71[6] == '\0');
  auVar64[7] = -(auVar71[7] == '\0');
  auVar64[8] = -(auVar71[8] == '\0');
  auVar64[9] = -(auVar71[9] == '\0');
  auVar64[10] = -(auVar71[10] == '\0');
  auVar64[0xb] = -(auVar71[0xb] == '\0');
  auVar64[0xc] = -(auVar71[0xc] == '\0');
  auVar64[0xd] = -(auVar71[0xd] == '\0');
  auVar64[0xe] = -(auVar71[0xe] == '\0');
  auVar64[0xf] = -(auVar71[0xf] == '\0');
  iVar1 = out[0x13];
  out[0x13] = out[0x1c];
  out[0x1c] = iVar1;
  return (uint)((ushort)((ushort)(SUB161(auVar101 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar101 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar101 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar101 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar101 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar101 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar101 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar101 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar101 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar101 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar101 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar101 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar101 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar101 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar101 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar101[0xf] >> 7) << 0xf) != 0xffff) +
         (uint)((ushort)((ushort)(SUB161(auVar64 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar64 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar64 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar64 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar64 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar64 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar64 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar64 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar64 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar64 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar64[0xf] >> 7) << 0xf) != 0xffff) * 2;
}

Assistant:

static WEBP_INLINE int DoQuantizeBlock_SSE2(
    int16_t in[16], int16_t out[16],
    const uint16_t* WEBP_RESTRICT const sharpen,
    const VP8Matrix* WEBP_RESTRICT const mtx) {
  const __m128i max_coeff_2047 = _mm_set1_epi16(MAX_LEVEL);
  const __m128i zero = _mm_setzero_si128();
  __m128i coeff0, coeff8;
  __m128i out0, out8;
  __m128i packed_out;

  // Load all inputs.
  __m128i in0 = _mm_loadu_si128((__m128i*)&in[0]);
  __m128i in8 = _mm_loadu_si128((__m128i*)&in[8]);
  const __m128i iq0 = _mm_loadu_si128((const __m128i*)&mtx->iq_[0]);
  const __m128i iq8 = _mm_loadu_si128((const __m128i*)&mtx->iq_[8]);
  const __m128i q0 = _mm_loadu_si128((const __m128i*)&mtx->q_[0]);
  const __m128i q8 = _mm_loadu_si128((const __m128i*)&mtx->q_[8]);

  // extract sign(in)  (0x0000 if positive, 0xffff if negative)
  const __m128i sign0 = _mm_cmpgt_epi16(zero, in0);
  const __m128i sign8 = _mm_cmpgt_epi16(zero, in8);

  // coeff = abs(in) = (in ^ sign) - sign
  coeff0 = _mm_xor_si128(in0, sign0);
  coeff8 = _mm_xor_si128(in8, sign8);
  coeff0 = _mm_sub_epi16(coeff0, sign0);
  coeff8 = _mm_sub_epi16(coeff8, sign8);

  // coeff = abs(in) + sharpen
  if (sharpen != NULL) {
    const __m128i sharpen0 = _mm_loadu_si128((const __m128i*)&sharpen[0]);
    const __m128i sharpen8 = _mm_loadu_si128((const __m128i*)&sharpen[8]);
    coeff0 = _mm_add_epi16(coeff0, sharpen0);
    coeff8 = _mm_add_epi16(coeff8, sharpen8);
  }

  // out = (coeff * iQ + B) >> QFIX
  {
    // doing calculations with 32b precision (QFIX=17)
    // out = (coeff * iQ)
    const __m128i coeff_iQ0H = _mm_mulhi_epu16(coeff0, iq0);
    const __m128i coeff_iQ0L = _mm_mullo_epi16(coeff0, iq0);
    const __m128i coeff_iQ8H = _mm_mulhi_epu16(coeff8, iq8);
    const __m128i coeff_iQ8L = _mm_mullo_epi16(coeff8, iq8);
    __m128i out_00 = _mm_unpacklo_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_04 = _mm_unpackhi_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_08 = _mm_unpacklo_epi16(coeff_iQ8L, coeff_iQ8H);
    __m128i out_12 = _mm_unpackhi_epi16(coeff_iQ8L, coeff_iQ8H);
    // out = (coeff * iQ + B)
    const __m128i bias_00 = _mm_loadu_si128((const __m128i*)&mtx->bias_[0]);
    const __m128i bias_04 = _mm_loadu_si128((const __m128i*)&mtx->bias_[4]);
    const __m128i bias_08 = _mm_loadu_si128((const __m128i*)&mtx->bias_[8]);
    const __m128i bias_12 = _mm_loadu_si128((const __m128i*)&mtx->bias_[12]);
    out_00 = _mm_add_epi32(out_00, bias_00);
    out_04 = _mm_add_epi32(out_04, bias_04);
    out_08 = _mm_add_epi32(out_08, bias_08);
    out_12 = _mm_add_epi32(out_12, bias_12);
    // out = QUANTDIV(coeff, iQ, B, QFIX)
    out_00 = _mm_srai_epi32(out_00, QFIX);
    out_04 = _mm_srai_epi32(out_04, QFIX);
    out_08 = _mm_srai_epi32(out_08, QFIX);
    out_12 = _mm_srai_epi32(out_12, QFIX);

    // pack result as 16b
    out0 = _mm_packs_epi32(out_00, out_04);
    out8 = _mm_packs_epi32(out_08, out_12);

    // if (coeff > 2047) coeff = 2047
    out0 = _mm_min_epi16(out0, max_coeff_2047);
    out8 = _mm_min_epi16(out8, max_coeff_2047);
  }

  // get sign back (if (sign[j]) out_n = -out_n)
  out0 = _mm_xor_si128(out0, sign0);
  out8 = _mm_xor_si128(out8, sign8);
  out0 = _mm_sub_epi16(out0, sign0);
  out8 = _mm_sub_epi16(out8, sign8);

  // in = out * Q
  in0 = _mm_mullo_epi16(out0, q0);
  in8 = _mm_mullo_epi16(out8, q8);

  _mm_storeu_si128((__m128i*)&in[0], in0);
  _mm_storeu_si128((__m128i*)&in[8], in8);

  // zigzag the output before storing it.
  //
  // The zigzag pattern can almost be reproduced with a small sequence of
  // shuffles. After it, we only need to swap the 7th (ending up in third
  // position instead of twelfth) and 8th values.
  {
    __m128i outZ0, outZ8;
    outZ0 = _mm_shufflehi_epi16(out0,  _MM_SHUFFLE(2, 1, 3, 0));
    outZ0 = _mm_shuffle_epi32  (outZ0, _MM_SHUFFLE(3, 1, 2, 0));
    outZ0 = _mm_shufflehi_epi16(outZ0, _MM_SHUFFLE(3, 1, 0, 2));
    outZ8 = _mm_shufflelo_epi16(out8,  _MM_SHUFFLE(3, 0, 2, 1));
    outZ8 = _mm_shuffle_epi32  (outZ8, _MM_SHUFFLE(3, 1, 2, 0));
    outZ8 = _mm_shufflelo_epi16(outZ8, _MM_SHUFFLE(1, 3, 2, 0));
    _mm_storeu_si128((__m128i*)&out[0], outZ0);
    _mm_storeu_si128((__m128i*)&out[8], outZ8);
    packed_out = _mm_packs_epi16(outZ0, outZ8);
  }
  {
    const int16_t outZ_12 = out[12];
    const int16_t outZ_3 = out[3];
    out[3] = outZ_12;
    out[12] = outZ_3;
  }

  // detect if all 'out' values are zeroes or not
  return (_mm_movemask_epi8(_mm_cmpeq_epi8(packed_out, zero)) != 0xffff);
}